

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMTreeWalkerImpl.cpp
# Opt level: O2

DOMNode * __thiscall xercesc_4_0::DOMTreeWalkerImpl::nextNode(DOMTreeWalkerImpl *this)

{
  DOMNode *pDVar1;
  DOMNode *node;
  
  if (this->fCurrentNode == (DOMNode *)0x0) {
    pDVar1 = (DOMNode *)0x0;
  }
  else {
    pDVar1 = getFirstChild(this,this->fCurrentNode);
    if ((pDVar1 == (DOMNode *)0x0) &&
       (pDVar1 = getNextSibling(this,this->fCurrentNode), pDVar1 == (DOMNode *)0x0)) {
      node = getParentNode(this,this->fCurrentNode);
      while( true ) {
        if (node == (DOMNode *)0x0) {
          return (DOMNode *)0x0;
        }
        pDVar1 = getNextSibling(this,node);
        if (pDVar1 != (DOMNode *)0x0) break;
        node = getParentNode(this,node);
      }
    }
    this->fCurrentNode = pDVar1;
  }
  return pDVar1;
}

Assistant:

DOMNode* DOMTreeWalkerImpl::nextNode () {

    if (!fCurrentNode) return 0;

    DOMNode* node = getFirstChild(fCurrentNode);

    if (node != 0) {
        fCurrentNode = node;
        return node;
    }
    else {

        node = getNextSibling(fCurrentNode);

        if (node != 0) {
            fCurrentNode = node;
            return node;
        }
        else {

            // return parent's 1st sibling.
            DOMNode* parent = getParentNode(fCurrentNode);
            while ( parent != 0) {
                node = getNextSibling(parent);
                if (node != 0) {
                    fCurrentNode = node;
                    return node;
                } else {
                    parent = getParentNode(parent);
                }
            }
            return node;
        }
    }
}